

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O3

Curl_addrinfo * Curl_ip2addr(int af,void *inaddr,char *hostname,int port)

{
  char **ppcVar1;
  hostent *he;
  char *pcVar2;
  Curl_addrinfo *pCVar3;
  int iVar4;
  
  he = (hostent *)(*Curl_cmalloc)(0x40);
  if (he == (hostent *)0x0) {
    return (Curl_addrinfo *)0x0;
  }
  pcVar2 = (*Curl_cstrdup)(hostname);
  if (pcVar2 == (char *)0x0) {
    pCVar3 = (Curl_addrinfo *)0x0;
    goto LAB_00130f14;
  }
  if (af == 10) {
    ppcVar1 = *(char ***)((long)inaddr + 8);
    he[1].h_name = *inaddr;
    he[1].h_aliases = ppcVar1;
    iVar4 = 0x10;
LAB_00130ed3:
    he->h_name = pcVar2;
    he->h_aliases = (char **)0x0;
    he->h_addrtype = af;
    he->h_length = iVar4;
    he->h_addr_list = (char **)&he[1].h_addrtype;
    *(hostent **)&he[1].h_addrtype = he + 1;
    he[1].h_addr_list = (char **)0x0;
    pCVar3 = Curl_he2ai(he,port);
  }
  else {
    if (af == 2) {
      *(undefined4 *)&he[1].h_name = *inaddr;
      iVar4 = 4;
      goto LAB_00130ed3;
    }
    pCVar3 = (Curl_addrinfo *)0x0;
  }
  (*Curl_cfree)(pcVar2);
LAB_00130f14:
  (*Curl_cfree)(he);
  return pCVar3;
}

Assistant:

Curl_addrinfo *
Curl_ip2addr(int af, const void *inaddr, const char *hostname, int port)
{
  Curl_addrinfo *ai;

#if defined(__VMS) && \
    defined(__INITIAL_POINTER_SIZE) && (__INITIAL_POINTER_SIZE == 64)
#pragma pointer_size save
#pragma pointer_size short
#pragma message disable PTRMISMATCH
#endif

  struct hostent  *h;
  struct namebuff *buf;
  char  *addrentry;
  char  *hoststr;
  size_t addrsize;

  DEBUGASSERT(inaddr && hostname);

  buf = malloc(sizeof(struct namebuff));
  if(!buf)
    return NULL;

  hoststr = strdup(hostname);
  if(!hoststr) {
    free(buf);
    return NULL;
  }

  switch(af) {
  case AF_INET:
    addrsize = sizeof(struct in_addr);
    addrentry = (void *)&buf->addrentry.ina4;
    memcpy(addrentry, inaddr, sizeof(struct in_addr));
    break;
#ifdef ENABLE_IPV6
  case AF_INET6:
    addrsize = sizeof(struct in6_addr);
    addrentry = (void *)&buf->addrentry.ina6;
    memcpy(addrentry, inaddr, sizeof(struct in6_addr));
    break;
#endif
  default:
    free(hoststr);
    free(buf);
    return NULL;
  }

  h = &buf->hostentry;
  h->h_name = hoststr;
  h->h_aliases = NULL;
  h->h_addrtype = (short)af;
  h->h_length = (short)addrsize;
  h->h_addr_list = &buf->h_addr_list[0];
  h->h_addr_list[0] = addrentry;
  h->h_addr_list[1] = NULL; /* terminate list of entries */

#if defined(__VMS) && \
    defined(__INITIAL_POINTER_SIZE) && (__INITIAL_POINTER_SIZE == 64)
#pragma pointer_size restore
#pragma message enable PTRMISMATCH
#endif

  ai = Curl_he2ai(h, port);

  free(hoststr);
  free(buf);

  return ai;
}